

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

void __thiscall
pbrt::anon_struct_8_1_2f67eb89::reportError(anon_struct_8_1_2f67eb89 *this,char *error)

{
  string local_38;
  char *local_18;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_18 = error;
  detail::stringPrintfRecursive<char_const*&>(&local_38,"%s",&local_18);
  Error((FileLoc *)0x0,local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void reportError(const char *error) override { Error("%s", error); }